

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,SchnorrPubkey *schnorr_pubkey)

{
  pointer puVar1;
  Pubkey local_58;
  Pubkey *local_40;
  SchnorrPubkey *local_38;
  
  this->key_type_ = kDescriptorKeySchnorr;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)schnorr_pubkey);
  local_38 = &this->schnorr_pubkey_;
  Pubkey::Pubkey(&this->pubkey_);
  local_40 = &this->pubkey_;
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  (this->argument_)._M_dataplus._M_p = (pointer)&(this->argument_).field_2;
  (this->argument_)._M_string_length = 0;
  (this->argument_).field_2._M_local_buf[0] = '\0';
  SchnorrPubkey::CreatePubkey(&local_58,schnorr_pubkey,false);
  puVar1 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const SchnorrPubkey& schnorr_pubkey)
    : key_type_(DescriptorKeyType::kDescriptorKeySchnorr),
      schnorr_pubkey_(schnorr_pubkey) {
  pubkey_ = schnorr_pubkey.CreatePubkey();
}